

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchAI.cpp
# Opt level: O2

void __thiscall tiger::trains::ai::SwitchAI::step(SwitchAI *this)

{
  pointer ppTVar1;
  TrainAI *bot_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  vector<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_> *pvVar6;
  Town *this_00;
  IPost *pIVar7;
  Train *pTVar8;
  pointer ppTVar9;
  ulong uVar10;
  TrainAI *bot;
  
  pvVar6 = world::World::getPlayerList(this->world);
  this_00 = (Town *)world::Player::getHome
                              (*(pvVar6->
                                super__Vector_base<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_>
                                )._M_impl.super__Vector_impl_data._M_start);
  iVar3 = world::Town::getPopulation(this_00);
  pvVar6 = world::World::getPlayerList(this->world);
  pIVar7 = world::Player::getHome
                     (*(pvVar6->
                       super__Vector_base<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_>
                       )._M_impl.super__Vector_impl_data._M_start);
  iVar4 = (*pIVar7->_vptr_IPost[0xb])(pIVar7);
  iVar3 = (iVar4 + iVar3) * 0x3c + -0x3c;
  ppTVar1 = (this->productBots).
            super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppTVar9 = (this->productBots).
                 super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppTVar9 != ppTVar1;
      ppTVar9 = ppTVar9 + 1) {
    bot_00 = *ppTVar9;
    bVar2 = canSwitch(this,bot_00);
    if (!bVar2) {
      pTVar8 = TrainAI::getTrain(bot_00);
      iVar4 = world::Train::getGoodsCapacity(pTVar8);
      iVar3 = iVar3 - iVar4;
    }
  }
  iVar4 = 0;
  while( true ) {
    uVar10 = (ulong)iVar4;
    ppTVar9 = (this->productBots).
              super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->productBots).
                      super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar9 >> 3) <= uVar10)
    break;
    bot = ppTVar9[uVar10];
    bVar2 = canSwitch(this,bot);
    if (bVar2) {
      if ((iVar3 < 1) &&
         (ppTVar9 = (this->productBots).
                    super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
         8 < (ulong)((long)(this->productBots).
                           super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar9))) {
        std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>::
        erase(&this->productBots,(const_iterator)(ppTVar9 + uVar10));
        TrainAI::changeType(bot,ARMOR);
        std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>::
        push_back(&this->armorBots,&bot);
        iVar4 = iVar4 + -1;
      }
      else {
        pTVar8 = TrainAI::getTrain(bot);
        iVar5 = world::Train::getGoodsCapacity(pTVar8);
        iVar3 = iVar3 - iVar5;
      }
    }
    iVar4 = iVar4 + 1;
  }
  iVar4 = 0;
  while( true ) {
    uVar10 = (ulong)iVar4;
    ppTVar9 = (this->armorBots).
              super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->armorBots).
                      super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar9 >> 3) <= uVar10)
    break;
    bot = ppTVar9[uVar10];
    bVar2 = canSwitch(this,bot);
    if (((bVar2) && (0 < iVar3)) &&
       (ppTVar9 = (this->armorBots).
                  super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
       8 < (ulong)((long)(this->armorBots).
                         super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar9))) {
      std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>::
      erase(&this->armorBots,(const_iterator)(ppTVar9 + uVar10));
      TrainAI::changeType(bot,PRODUCT);
      std::vector<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>::
      push_back(&this->productBots,&bot);
    }
    else {
      iVar4 = iVar4 + 1;
    }
  }
  return;
}

Assistant:

void SwitchAI::step()
{
    int population = static_cast<world::Town *>(world->getPlayerList()[0]->getHome())->getPopulation();
    int needProductCompacity;
    int level = static_cast<world::Town *>(world->getPlayerList()[0]->getHome())->getLevel();

    needProductCompacity = 60 *(population + level - 1);


    for (TrainAI *bot : productBots)
        if (!canSwitch(bot))
            needProductCompacity -= bot->getTrain()->getGoodsCapacity();


    int i = 0;

    while (i < productBots.size())
    {
        TrainAI *bot = productBots[i];

        if (canSwitch(bot))
            if (needProductCompacity > 0 || productBots.size() < 2)
                needProductCompacity -= bot->getTrain()->getGoodsCapacity();
            else
            {
                productBots.erase(productBots.begin() + i);
                bot->changeType(models::GoodType::ARMOR);
                armorBots.push_back(bot);
                i--;
            }

        i++;
    }

    i = 0;

    while (i < armorBots.size())
    {
        TrainAI *bot = armorBots[i];

        if (canSwitch(bot) && needProductCompacity > 0 && armorBots.size() > 1)
        {
            armorBots.erase(armorBots.begin() + i);
            bot->changeType(models::GoodType::PRODUCT);
            productBots.push_back(bot);
        }
        else
            i++;
    }
}